

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrycollection.cpp
# Opt level: O3

Primitive * newPrimitive(Json *conf)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vec2f vVar4;
  vec3f vn2;
  vec3f vn3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  value_t vVar12;
  bool bVar13;
  const_reference pvVar14;
  mapped_type *ppPVar15;
  RevSurface *this;
  runtime_error *this_00;
  Triangle *this_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  vec3f vVar16;
  vec3f v1;
  vec3f v2;
  vec3f v3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  double ret;
  iterator local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  vec2f local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"mesh");
  if (bVar11) {
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"file");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,pvVar14);
    ppPVar15 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(anonymous_namespace)::meshref_abi_cxx11_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ret);
    this = (RevSurface *)*ppPVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret != &aStack_120) {
      operator_delete((void *)ret,aStack_120._M_allocated_capacity + 1);
    }
  }
  else {
    this = (RevSurface *)0x0;
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"sphere");
  if (bVar11) {
    this = (RevSurface *)operator_new(0x18);
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"origin");
    vVar16 = json2vec3f(pvVar14);
    local_e8._8_4_ = extraout_XMM0_Dc;
    local_e8._0_8_ = vVar16._0_8_;
    local_e8._12_4_ = extraout_XMM0_Dd;
    local_f8._0_4_ = vVar16.z;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"radius");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar14,&ret);
    (this->super_ParamSurface).super_Primitive._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016a128;
    (this->super_ParamSurface).mesh = (BasicContainer *)local_e8._0_8_;
    *(undefined4 *)&this->curve = local_f8._0_4_;
    *(float *)((long)&this->curve + 4) = (float)ret;
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"plane");
  if (bVar11) {
    this = (RevSurface *)operator_new(0x18);
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normal");
    vVar16 = json2vec3f(pvVar14);
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._0_8_ = vVar16._0_8_;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    local_f8._0_4_ = vVar16.z;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"offset");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar14,&ret);
    (this->super_ParamSurface).super_Primitive._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016a188;
    (this->super_ParamSurface).mesh = (BasicContainer *)local_e8._0_8_;
    *(undefined4 *)&this->curve = local_f8._0_4_;
    *(float *)((long)&this->curve + 4) = (float)ret;
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"cube");
  if (bVar11) {
    this = (RevSurface *)operator_new(8);
    (this->super_ParamSurface).super_Primitive._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016a1e8;
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"quad");
  if (bVar11) {
    this = (RevSurface *)operator_new(8);
    (this->super_ParamSurface).super_Primitive._vptr_Primitive =
         (_func_int **)&PTR_intersect_0016a228;
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"revsurface");
  if (bVar11) {
    this = (RevSurface *)operator_new(0x18);
    RevSurface::RevSurface(this,conf);
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"type");
  bVar11 = nlohmann::operator==<const_char_*,_0>(pvVar14,"triangle");
  if (!bVar11) {
    if (this != (RevSurface *)0x0) {
      return (Primitive *)this;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"type");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_150,pvVar14);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   "Unrecognized Geometric type: ",&local_150);
    std::runtime_error::runtime_error(this_00,(string *)&ret);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"vertices");
  pvVar14 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](pvVar14,0);
  vVar16 = json2vec3f(pvVar14);
  local_fc = vVar16.z;
  local_38._8_4_ = extraout_XMM0_Dc_01;
  local_38._0_8_ = vVar16._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd_01;
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"vertices");
  pvVar14 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](pvVar14,1);
  vVar16 = json2vec3f(pvVar14);
  local_100 = vVar16.z;
  local_48._8_4_ = extraout_XMM0_Dc_02;
  local_48._0_8_ = vVar16._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd_02;
  pvVar14 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"vertices");
  pvVar14 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](pvVar14,2);
  vVar16 = json2vec3f(pvVar14);
  local_104 = vVar16.z;
  local_58._8_4_ = extraout_XMM0_Dc_03;
  local_58._0_8_ = vVar16._0_8_;
  local_58._12_4_ = extraout_XMM0_Dd_03;
  local_128._M_node = (_Base_ptr)0x0;
  aStack_120._M_allocated_capacity = 0;
  aStack_120._8_8_ = 0x8000000000000000;
  vVar12 = conf->m_type;
  ret = (double)conf;
  if (vVar12 == object) {
    local_128._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[8],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [8])0x156b8d);
    vVar12 = conf->m_type;
LAB_00130fac:
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity = 0;
    local_150.field_2._8_8_ = 0x8000000000000000;
    if (vVar12 == array) goto LAB_00130fd9;
    if (vVar12 == object) {
      local_150._M_string_length =
           (size_type)&(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_150.field_2._8_8_ = 1;
    }
  }
  else {
    if (vVar12 != array) {
      aStack_120._8_8_ = 1;
      goto LAB_00130fac;
    }
    aStack_120._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
LAB_00130fd9:
    local_150.field_2._8_8_ = 0x8000000000000000;
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_150._M_dataplus._M_p = (pointer)conf;
  bVar11 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&ret,(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_150);
  auVar5._12_4_ = 0;
  auVar5._0_12_ = local_e8._4_12_;
  local_e8._0_16_ = auVar5 << 0x20;
  local_f8 = ZEXT816(0);
  local_108 = 0.0;
  local_68 = ZEXT816(0);
  local_10c = 0.0;
  local_78 = ZEXT816(0);
  if (!bVar11) {
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normals");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,0);
    vVar16 = json2vec3f(pvVar14);
    local_f8._8_4_ = extraout_XMM0_Dc_04;
    local_f8._0_8_ = vVar16._0_8_;
    local_f8._12_4_ = extraout_XMM0_Dd_04;
    local_e8._0_4_ = vVar16.z;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normals");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,1);
    vVar16 = json2vec3f(pvVar14);
    local_108 = vVar16.z;
    local_68._8_4_ = extraout_XMM0_Dc_05;
    local_68._0_8_ = vVar16._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd_05;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"normals");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,2);
    vVar16 = json2vec3f(pvVar14);
    local_10c = vVar16.z;
    local_78._8_4_ = extraout_XMM0_Dc_06;
    local_78._0_8_ = vVar16._0_8_;
    local_78._12_4_ = extraout_XMM0_Dd_06;
  }
  local_128._M_node = (_Base_ptr)0x0;
  aStack_120._M_allocated_capacity = 0;
  aStack_120._8_8_ = 0x8000000000000000;
  vVar12 = conf->m_type;
  if (vVar12 == object) {
    ret = (double)conf;
    local_128._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[4],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [4])"uvs");
    vVar12 = conf->m_type;
LAB_00131134:
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity = 0;
    local_150.field_2._8_8_ = 0x8000000000000000;
    if (vVar12 == array) goto LAB_00131161;
    if (vVar12 == object) {
      local_150._M_string_length =
           (size_type)&(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_150.field_2._8_8_ = 1;
    }
  }
  else {
    if (vVar12 != array) {
      aStack_120._8_8_ = 1;
      ret = (double)conf;
      goto LAB_00131134;
    }
    aStack_120._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    ret = (double)conf;
LAB_00131161:
    local_150.field_2._8_8_ = 0x8000000000000000;
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_150._M_dataplus._M_p = (pointer)conf;
  bVar13 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&ret,(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_150);
  if (bVar13) {
    local_88 = ZEXT816(0);
    local_a0.x = 0.0;
    local_a0.y = 0.0;
    local_98 = ZEXT816(0);
  }
  else {
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"uvs");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,0);
    vVar4 = json2vec2f(pvVar14);
    local_88._8_4_ = extraout_XMM0_Dc_07;
    local_88._0_4_ = vVar4.x;
    local_88._4_4_ = vVar4.y;
    local_88._12_4_ = extraout_XMM0_Dd_07;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"uvs");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,1);
    vVar4 = json2vec2f(pvVar14);
    local_98._8_4_ = extraout_XMM0_Dc_08;
    local_98._0_4_ = vVar4.x;
    local_98._4_4_ = vVar4.y;
    local_98._12_4_ = extraout_XMM0_Dd_08;
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"uvs");
    pvVar14 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](pvVar14,2);
    local_a0 = json2vec2f(pvVar14);
  }
  this_01 = (Triangle *)operator_new(0xa0);
  auVar10 = local_38;
  auVar9 = local_48;
  auVar8 = local_58;
  auVar7 = local_68;
  auVar6 = local_78;
  auVar5 = local_f8;
  local_b0 = local_f8._0_8_;
  local_a8 = (float)local_e8._0_4_;
  local_c0 = local_68._0_8_;
  local_b8 = local_108;
  local_d0 = local_78._0_8_;
  local_c8 = local_10c;
  vVar16.z = (float)local_e8._0_4_;
  vVar16.x = (float)local_f8._0_4_;
  vVar16.y = (float)local_f8._4_4_;
  vn2.z = local_108;
  vn2.x = (float)local_68._0_4_;
  vn2.y = (float)local_68._4_4_;
  vn3.z = local_10c;
  vn3.x = (float)local_78._0_4_;
  vn3.y = (float)local_78._4_4_;
  v1.z = local_fc;
  v1.x = (float)local_38._0_4_;
  v1.y = (float)local_38._4_4_;
  v2.z = local_100;
  v2.x = (float)local_48._0_4_;
  v2.y = (float)local_48._4_4_;
  v3.z = local_104;
  v3.x = (float)local_58._0_4_;
  v3.y = (float)local_58._4_4_;
  local_f8 = auVar5;
  local_78 = auVar6;
  local_68 = auVar7;
  local_58 = auVar8;
  local_48 = auVar9;
  local_38 = auVar10;
  Triangle::Triangle(this_01,v1,v2,v3,(vec2f)local_88._0_8_,(vec2f)local_98._0_8_,local_a0,vVar16,
                     vn2,vn3);
  local_128._M_node = (_Base_ptr)0x0;
  aStack_120._M_allocated_capacity = 0;
  aStack_120._8_8_ = 0x8000000000000000;
  vVar12 = conf->m_type;
  if (vVar12 == object) {
    ret = (double)conf;
    local_128._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[18],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [18])"recompute_normals");
    vVar12 = conf->m_type;
LAB_00131379:
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity = 0;
    local_150.field_2._8_8_ = 0x8000000000000000;
    if (vVar12 != array) {
      if (vVar12 == object) {
        local_150._M_string_length =
             (size_type)&(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        local_150.field_2._8_8_ = 1;
      }
      goto LAB_001313be;
    }
  }
  else {
    if (vVar12 != array) {
      aStack_120._8_8_ = 1;
      ret = (double)conf;
      goto LAB_00131379;
    }
    aStack_120._M_allocated_capacity =
         (size_type)
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    ret = (double)conf;
  }
  local_150.field_2._8_8_ = 0x8000000000000000;
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity =
       (size_type)
       (((conf->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_001313be:
  local_150._M_dataplus._M_p = (pointer)conf;
  bVar13 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&ret,(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_150);
  if (bVar13) {
    if (!bVar11) {
      return (Primitive *)this_01;
    }
  }
  else {
    pvVar14 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)conf,"recompute_normals");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar14,(boolean_t *)&ret);
    if (ret._0_1_ == '\0') {
      return (Primitive *)this_01;
    }
  }
  fVar1 = (this_01->planeNormal).z;
  (this_01->vn3).z = fVar1;
  uVar2 = (this_01->planeNormal).x;
  uVar3 = (this_01->planeNormal).y;
  (this_01->vn3).x = (float)uVar2;
  (this_01->vn3).y = (float)uVar3;
  (this_01->vn2).x = (float)uVar2;
  (this_01->vn2).y = (float)uVar3;
  (this_01->vn2).z = fVar1;
  (this_01->vn1).x = (float)uVar2;
  (this_01->vn1).y = (float)uVar3;
  (this_01->vn1).z = fVar1;
  return (Primitive *)this_01;
}

Assistant:

Primitive* newPrimitive(const Json& conf)
{
	Primitive* shape = NULL;
	if (conf["type"] == "mesh") {
		shape = meshref[conf["file"]];
	}
	if (conf["type"] == "sphere") {
		shape = new Sphere(json2vec3f(conf["origin"]), (double)conf["radius"]);
	}
	if (conf["type"] == "plane") {
		shape = new Plane(json2vec3f(conf["normal"]), (double)conf["offset"]);
	}
	if (conf["type"] == "cube") {
		shape = new Cube();
	}
	if (conf["type"] == "quad") {
		shape = new Quad();
	}
	if (conf["type"] == "revsurface") {
		shape = new RevSurface(conf);
	}
	if (conf["type"] == "triangle") {
		vec3f v1,v2,v3,n1,n2,n3;
		bool recompute_normal = true;
		v1 = json2vec3f(conf["vertices"][0]);
		v2 = json2vec3f(conf["vertices"][1]);
		v3 = json2vec3f(conf["vertices"][2]);
		if (conf.find("normals") != conf.end()) {
			recompute_normal = false;
			n1 = json2vec3f(conf["normals"][0]);
			n2 = json2vec3f(conf["normals"][1]);
			n3 = json2vec3f(conf["normals"][2]);
		}
		vec2f t1,t2,t3;
		if (conf.find("uvs") != conf.end()) {
			t1 = json2vec2f(conf["uvs"][0]);
			t2 = json2vec2f(conf["uvs"][1]);
			t3 = json2vec2f(conf["uvs"][2]);
		}
		Triangle* tshape = new Triangle(v1,v2,v3,t1,t2,t3,n1,n2,n3);
		if (conf.find("recompute_normals") != conf.end())
			recompute_normal = conf["recompute_normals"];
		if (recompute_normal)
			tshape->recompute_normal();
		shape = tshape;
	}
	if (shape == NULL) {
		throw std::runtime_error("Unrecognized Geometric type: " + std::string(conf["type"]));
	}
	return shape;
}